

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokPubkeyVal(octet *pubkey,size_t pubkey_len)

{
  ulong in_RSI;
  bign_params params [1];
  err_t code;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  bign_params *in_stack_fffffffffffffe88;
  octet *in_stack_fffffffffffffea0;
  bign_params *in_stack_fffffffffffffea8;
  octet *in_stack_fffffffffffffeb0;
  bign_params *in_stack_fffffffffffffeb8;
  undefined4 local_4;
  
  if ((in_RSI & 1) == 0) {
    local_4 = btokParamsStd(in_stack_fffffffffffffe88,
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    if (local_4 == 0) {
      if (in_RSI == 0x30) {
        local_4 = bign96PubkeyVal(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      }
      else {
        local_4 = bignPubkeyVal(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      }
    }
  }
  else {
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

static err_t btokPubkeyVal(const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	bign_params params[1];
	// входной контроль
	if (pubkey_len % 2)
		return ERR_BAD_INPUT;
	// загрузить параметры
	code = btokParamsStd(params, pubkey_len / 2);
	ERR_CALL_CHECK(code);
	// проверить ключ
	return pubkey_len == 48 ? bign96PubkeyVal(params, pubkey) :
		bignPubkeyVal(params, pubkey);
}